

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O0

code_point
nowide::utf::utf_traits<wchar_t,4>::decode<wchar_t_const*>(wchar_t **current,wchar_t *last)

{
  wchar_t *pwVar1;
  bool bVar2;
  code_point c;
  wchar_t *last_local;
  wchar_t **current_local;
  
  if (*current == last) {
    current_local._4_4_ = L'\xfffffffe';
  }
  else {
    pwVar1 = *current;
    *current = pwVar1 + 1;
    current_local._4_4_ = *pwVar1;
    bVar2 = is_valid_codepoint(current_local._4_4_);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      current_local._4_4_ = L'\xffffffff';
    }
  }
  return current_local._4_4_;
}

Assistant:

static code_point decode(It &current,It last)
        {
            if(NOWIDE_UNLIKELY(current == last))
                return nowide::utf::incomplete;
            code_point c=*current++;
            if(NOWIDE_UNLIKELY(!is_valid_codepoint(c)))
                return nowide::utf::illegal;
            return c;
        }